

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool testing::internal::ParameterizedTestSuiteInfo<rtripProblems>::IsValidParamName(string *name)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  ulong local_20;
  size_type index;
  string *name_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    for (local_20 = 0; uVar2 = std::__cxx11::string::size(), local_20 < uVar2;
        local_20 = local_20 + 1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)name);
      bVar1 = IsAlNum(*pcVar3);
      if ((!bVar1) &&
         (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)name), *pcVar3 != '_')) {
        return false;
      }
    }
    name_local._7_1_ = true;
  }
  else {
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

static bool IsValidParamName(const std::string& name) {
    // Check for empty string
    if (name.empty()) return false;

    // Check for invalid characters
    for (std::string::size_type index = 0; index < name.size(); ++index) {
      if (!IsAlNum(name[index]) && name[index] != '_') return false;
    }

    return true;
  }